

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

pool_ptr<soul::AST::Block> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::Block>
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Block> *o)

{
  Statement *pSVar1;
  long *in_RDX;
  
  if (*in_RDX == 0) {
    pSVar1 = (Statement *)0x0;
  }
  else {
    if (*in_RDX == 0) {
      throwInternalCompilerError("is_type<Type> (o)","visitAs",0x1cd);
    }
    if ((Statement *)*in_RDX == (Statement *)0x0) {
      throwInternalCompilerError("object != nullptr","operator*",0x3b);
    }
    pSVar1 = visitObject((RewritingASTVisitor *)o,(Statement *)*in_RDX);
  }
  this->_vptr_RewritingASTVisitor = (_func_int **)pSVar1;
  return (pool_ptr<soul::AST::Block>)(Block *)this;
}

Assistant:

pool_ptr<Type> visitAs (pool_ptr<Type> o)
    {
        if (o == nullptr)
            return {};

        SOUL_ASSERT (is_type<Type> (o));
        return static_cast<Type&> (visitObject (*o));
    }